

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBackCompatBlosc.cpp
# Opt level: O0

void __thiscall
adios2::format::BPBackCompatBlosc::GetMetadata
          (BPBackCompatBlosc *this,vector<char,_std::allocator<char>_> *buffer,Params *info)

{
  mapped_type *pmVar1;
  size_t position;
  undefined8 in_stack_ffffffffffffff20;
  bool isLittleEndian;
  size_t *in_stack_ffffffffffffff28;
  allocator *paVar2;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  string *this_00;
  allocator local_a9;
  key_type *in_stack_ffffffffffffff58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff60;
  string local_88 [39];
  allocator local_61;
  string local_60 [32];
  string local_40 [32];
  undefined8 local_20;
  
  local_20 = 0;
  isLittleEndian = SUB81((ulong)in_stack_ffffffffffffff20 >> 0x38,0);
  helper::ReadValue<unsigned_long>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,isLittleEndian);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"InputSize",&local_61);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  this_00 = local_40;
  std::__cxx11::string::operator=((string *)pmVar1,this_00);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string(this_00);
  helper::ReadValue<unsigned_long>
            ((vector<char,_std::allocator<char>_> *)this_00,in_stack_ffffffffffffff28,isLittleEndian
            );
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff58);
  paVar2 = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff58,"OutputSize",paVar2);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::operator=((string *)pmVar1,local_88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::__cxx11::string::~string(local_88);
  return;
}

Assistant:

void BPBackCompatBlosc::GetMetadata(const std::vector<char> &buffer, Params &info) const noexcept
{
    size_t position = 0;
    info["InputSize"] = std::to_string(helper::ReadValue<uint64_t>(buffer, position));
    info["OutputSize"] = std::to_string(helper::ReadValue<uint64_t>(buffer, position));
}